

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LocalSingleStoreElimPass::InitExtensionAllowList(LocalSingleStoreElimPass *this)

{
  long lVar1;
  allocator<char> local_7b3;
  allocator<char> local_7b2;
  allocator<char> local_7b1;
  allocator<char> local_7b0;
  allocator<char> local_7af;
  allocator<char> local_7ae;
  allocator<char> local_7ad;
  allocator<char> local_7ac;
  allocator<char> local_7ab;
  allocator<char> local_7aa;
  allocator<char> local_7a9;
  allocator<char> local_7a8;
  allocator<char> local_7a7;
  allocator<char> local_7a6;
  allocator<char> local_7a5;
  allocator<char> local_7a4;
  allocator<char> local_7a3;
  allocator<char> local_7a2;
  allocator<char> local_7a1;
  allocator<char> local_7a0;
  allocator<char> local_79f;
  allocator<char> local_79e;
  allocator<char> local_79d;
  allocator<char> local_79c;
  allocator<char> local_79b;
  allocator<char> local_79a;
  allocator<char> local_799;
  allocator<char> local_798;
  allocator<char> local_797;
  allocator<char> local_796;
  allocator<char> local_795;
  allocator<char> local_794;
  allocator<char> local_793;
  allocator<char> local_792;
  allocator<char> local_791;
  allocator<char> local_790;
  allocator<char> local_78f;
  allocator<char> local_78e;
  allocator<char> local_78d;
  allocator<char> local_78c;
  allocator<char> local_78b;
  allocator<char> local_78a;
  allocator<char> local_789;
  allocator<char> local_788;
  allocator<char> local_787;
  allocator<char> local_786;
  allocator<char> local_785;
  allocator<char> local_784;
  allocator<char> local_783;
  allocator<char> local_782;
  allocator<char> local_781;
  allocator<char> local_780;
  allocator<char> local_77f;
  allocator<char> local_77e;
  allocator<char> local_77d;
  allocator<char> local_77c;
  allocator<char> local_77b;
  allocator<char> local_77a;
  allocator<char> local_779;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,"SPV_AMD_shader_explicit_vertex_parameter",&local_779);
  std::__cxx11::string::string<std::allocator<char>>
            (local_758,"SPV_AMD_shader_trinary_minmax",&local_77a);
  std::__cxx11::string::string<std::allocator<char>>(local_738,"SPV_AMD_gcn_shader",&local_77b);
  std::__cxx11::string::string<std::allocator<char>>(local_718,"SPV_KHR_shader_ballot",&local_77c);
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"SPV_AMD_shader_ballot",&local_77d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d8,"SPV_AMD_gpu_shader_half_float",&local_77e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b8,"SPV_KHR_shader_draw_parameters",&local_77f);
  std::__cxx11::string::string<std::allocator<char>>(local_698,"SPV_KHR_subgroup_vote",&local_780);
  std::__cxx11::string::string<std::allocator<char>>(local_678,"SPV_KHR_8bit_storage",&local_781);
  std::__cxx11::string::string<std::allocator<char>>(local_658,"SPV_KHR_16bit_storage",&local_782);
  std::__cxx11::string::string<std::allocator<char>>(local_638,"SPV_KHR_device_group",&local_783);
  std::__cxx11::string::string<std::allocator<char>>(local_618,"SPV_KHR_multiview",&local_784);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,"SPV_NVX_multiview_per_view_attributes",&local_785);
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"SPV_NV_viewport_array2",&local_786);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,"SPV_NV_stereo_view_rendering",&local_787);
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,"SPV_NV_sample_mask_override_coverage",&local_788);
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,"SPV_NV_geometry_shader_passthrough",&local_789);
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,"SPV_AMD_texture_gather_bias_lod",&local_78a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,"SPV_KHR_storage_buffer_storage_class",&local_78b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,"SPV_KHR_variable_pointers",&local_78c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,"SPV_AMD_gpu_shader_int16",&local_78d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"SPV_KHR_post_depth_coverage",&local_78e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,"SPV_KHR_shader_atomic_counter_ops",&local_78f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,"SPV_EXT_shader_stencil_export",&local_790);
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,"SPV_EXT_shader_viewport_index_layer",&local_791);
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"SPV_AMD_shader_image_load_store_lod",&local_792);
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"SPV_AMD_shader_fragment_mask",&local_793);
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"SPV_EXT_fragment_fully_covered",&local_794);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"SPV_AMD_gpu_shader_half_float_fetch",&local_795);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"SPV_GOOGLE_decorate_string",&local_796);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b8,"SPV_GOOGLE_hlsl_functionality1",&local_797);
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"SPV_NV_shader_subgroup_partitioned",&local_798);
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"SPV_EXT_descriptor_indexing",&local_799);
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"SPV_NV_fragment_shader_barycentric",&local_79a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"SPV_NV_compute_shader_derivatives",&local_79b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_318,"SPV_NV_shader_image_footprint",&local_79c);
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"SPV_NV_shading_rate",&local_79d);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"SPV_NV_mesh_shader",&local_79e);
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"SPV_EXT_mesh_shader",&local_79f);
  std::__cxx11::string::string<std::allocator<char>>(local_298,"SPV_NV_ray_tracing",&local_7a0);
  std::__cxx11::string::string<std::allocator<char>>(local_278,"SPV_KHR_ray_query",&local_7a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"SPV_EXT_fragment_invocation_density",&local_7a2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"SPV_EXT_physical_storage_buffer",&local_7a3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"SPV_KHR_physical_storage_buffer",&local_7a4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"SPV_KHR_terminate_invocation",&local_7a5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"SPV_KHR_subgroup_uniform_control_flow",&local_7a6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"SPV_KHR_integer_dot_product",&local_7a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"SPV_EXT_shader_image_int64",&local_7a8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"SPV_KHR_non_semantic_info",&local_7a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"SPV_KHR_uniform_group_instructions",&local_7aa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"SPV_KHR_fragment_shader_barycentric",&local_7ab);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"SPV_KHR_vulkan_memory_model",&local_7ac);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"SPV_NV_bindless_texture",&local_7ad);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"SPV_EXT_shader_atomic_float_add",&local_7ae);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"SPV_EXT_fragment_shader_interlock",&local_7af);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"SPV_NV_compute_shader_derivatives",&local_7b0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"SPV_NV_cooperative_matrix",&local_7b1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"SPV_KHR_cooperative_matrix",&local_7b2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"SPV_KHR_ray_tracing_position_fetch",&local_7b3);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::insert<std::__cxx11::string_const*>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->extensions_allowlist_,&local_778,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  lVar1 = 0x740;
  do {
    std::__cxx11::string::_M_dispose();
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void LocalSingleStoreElimPass::InitExtensionAllowList() {
  extensions_allowlist_.insert({"SPV_AMD_shader_explicit_vertex_parameter",
                                "SPV_AMD_shader_trinary_minmax",
                                "SPV_AMD_gcn_shader",
                                "SPV_KHR_shader_ballot",
                                "SPV_AMD_shader_ballot",
                                "SPV_AMD_gpu_shader_half_float",
                                "SPV_KHR_shader_draw_parameters",
                                "SPV_KHR_subgroup_vote",
                                "SPV_KHR_8bit_storage",
                                "SPV_KHR_16bit_storage",
                                "SPV_KHR_device_group",
                                "SPV_KHR_multiview",
                                "SPV_NVX_multiview_per_view_attributes",
                                "SPV_NV_viewport_array2",
                                "SPV_NV_stereo_view_rendering",
                                "SPV_NV_sample_mask_override_coverage",
                                "SPV_NV_geometry_shader_passthrough",
                                "SPV_AMD_texture_gather_bias_lod",
                                "SPV_KHR_storage_buffer_storage_class",
                                "SPV_KHR_variable_pointers",
                                "SPV_AMD_gpu_shader_int16",
                                "SPV_KHR_post_depth_coverage",
                                "SPV_KHR_shader_atomic_counter_ops",
                                "SPV_EXT_shader_stencil_export",
                                "SPV_EXT_shader_viewport_index_layer",
                                "SPV_AMD_shader_image_load_store_lod",
                                "SPV_AMD_shader_fragment_mask",
                                "SPV_EXT_fragment_fully_covered",
                                "SPV_AMD_gpu_shader_half_float_fetch",
                                "SPV_GOOGLE_decorate_string",
                                "SPV_GOOGLE_hlsl_functionality1",
                                "SPV_NV_shader_subgroup_partitioned",
                                "SPV_EXT_descriptor_indexing",
                                "SPV_NV_fragment_shader_barycentric",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_shader_image_footprint",
                                "SPV_NV_shading_rate",
                                "SPV_NV_mesh_shader",
                                "SPV_EXT_mesh_shader",
                                "SPV_NV_ray_tracing",
                                "SPV_KHR_ray_query",
                                "SPV_EXT_fragment_invocation_density",
                                "SPV_EXT_physical_storage_buffer",
                                "SPV_KHR_physical_storage_buffer",
                                "SPV_KHR_terminate_invocation",
                                "SPV_KHR_subgroup_uniform_control_flow",
                                "SPV_KHR_integer_dot_product",
                                "SPV_EXT_shader_image_int64",
                                "SPV_KHR_non_semantic_info",
                                "SPV_KHR_uniform_group_instructions",
                                "SPV_KHR_fragment_shader_barycentric",
                                "SPV_KHR_vulkan_memory_model",
                                "SPV_NV_bindless_texture",
                                "SPV_EXT_shader_atomic_float_add",
                                "SPV_EXT_fragment_shader_interlock",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_cooperative_matrix",
                                "SPV_KHR_cooperative_matrix",
                                "SPV_KHR_ray_tracing_position_fetch"});
}